

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  pointer pIVar5;
  int *piVar6;
  IdxElement *keys;
  int iVar7;
  uint uVar8;
  DataKey DVar9;
  long lVar10;
  undefined4 *puVar11;
  pointer pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  steeppr *psVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  uint *puVar17;
  long lVar18;
  byte bVar19;
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [13];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  undefined1 local_2b4 [20];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [13];
  undefined3 uStack_243;
  int iStack_240;
  bool bStack_23c;
  undefined8 local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  steeppr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar19 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2c0._0_4_ = cpp_dec_float_finite;
  local_2c0._4_4_ = 0x1c;
  local_338._0_16_ = (undefined1  [16])0x0;
  local_338._16_16_ = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = false;
  local_238._0_4_ = cpp_dec_float_finite;
  local_238._4_4_ = 0x1c;
  local_2b4._4_16_ = (undefined1  [16])0x0;
  local_2a0 = (undefined1  [16])0x0;
  local_290 = (undefined1  [16])0x0;
  local_280 = (undefined1  [16])0x0;
  local_270 = (undefined1  [16])0x0;
  local_260 = (undefined1  [16])0x0;
  local_250 = SUB1613((undefined1  [16])0x0,0);
  uStack_243 = 0;
  iStack_240 = 0;
  bStack_23c = false;
  pIVar5 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar5) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar5;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  lVar18 = (long)(pSVar2->infeasibilities).super_IdxSet.num;
  if (0 < lVar18) {
    lVar18 = lVar18 + 1;
    do {
      iVar1 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->infeasibilities).super_IdxSet.idx[lVar18 + -2];
      pnVar12 = pnVar3 + iVar1;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_338;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4);
      }
      iStack_2c8 = pnVar3[iVar1].m_backend.exp;
      bStack_2c4 = pnVar3[iVar1].m_backend.neg;
      local_2c0._0_4_ = pnVar3[iVar1].m_backend.fpclass;
      local_2c0._4_4_ = pnVar3[iVar1].m_backend.prec_elem;
      pnVar13 = feastol;
      pcVar14 = &result.m_backend;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar14->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4);
      }
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      if (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      if (result.m_backend.fpclass == cpp_dec_float_NaN ||
          (fpclass_type)local_2c0 == cpp_dec_float_NaN) {
LAB_005b4016:
        pSVar2 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar6 = (pSVar2->infeasibilities).super_IdxSet.idx;
        iVar7 = (pSVar2->infeasibilities).super_IdxSet.num;
        (pSVar2->infeasibilities).super_IdxSet.num = iVar7 + -1;
        piVar6[lVar18 + -2] = piVar6[(long)iVar7 + -1];
        (pSVar2->isInfeasible).data[iVar1] = 0;
      }
      else {
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_338,&result.m_backend);
        if (-1 < iVar7) goto LAB_005b4016;
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar1] = 1;
        puVar11 = (undefined4 *)local_338;
        psVar15 = local_b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(undefined4 *)psVar15 = *puVar11;
          puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
          psVar15 = psVar15 + (ulong)bVar19 * -8 + 4;
        }
        local_40 = iStack_2c8;
        local_3c = bStack_2c4;
        local_38 = (fpclass_type)local_2c0;
        iStack_34 = local_2c0._4_4_;
        pnVar12 = pnVar4 + iVar1;
        pnVar13 = &local_130;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar4[iVar1].m_backend.exp;
        local_130.m_backend.neg = pnVar4[iVar1].m_backend.neg;
        local_130.m_backend.fpclass = pnVar4[iVar1].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar4[iVar1].m_backend.prec_elem;
        pnVar13 = feastol;
        pnVar16 = &local_1b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_b0,&local_130,&local_1b0,&local_130);
        pnVar13 = &result;
        puVar17 = (uint *)(local_2b4 + 4);
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar17 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
          puVar17 = puVar17 + (ulong)bVar19 * -2 + 1;
        }
        iStack_240 = result.m_backend.exp;
        bStack_23c = result.m_backend.neg;
        local_238._0_4_ = result.m_backend.fpclass;
        local_238._4_4_ = result.m_backend.prec_elem;
        local_2b4._0_4_ = iVar1;
        std::
        vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
        ::push_back(&(this->prices).data,(value_type *)local_2b4);
      }
      lVar18 = lVar18 + -1;
    } while (1 < lVar18);
  }
  keys = (this->prices).data.
         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar5 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  uVar8 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    (keys,&(this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).compare,0,(int)((ulong)((long)pIVar5 - (long)keys) >> 2) * 0x3e0f83e1,
                     100,0,0,true);
  if (0 < (int)uVar8) {
    lVar18 = 0;
    do {
      DIdxSet::addIdx(&this->bestPrices,
                      *(int *)((long)&(((this->prices).data.
                                        super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                              lVar18 + -4));
      (((this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thesolver)->isInfeasible).data
      [*(int *)((long)&(((this->prices).data.
                         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + lVar18 + -4)]
           = 2;
      lVar18 = lVar18 + 0x84;
    } while ((ulong)uVar8 * 0x84 != lVar18);
  }
  if ((int)uVar8 < 1) {
    DVar9.info = 0;
    DVar9.idx = -1;
  }
  else {
    pIVar5 = (this->prices).data.
             super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar13 = &pIVar5->val;
    pnVar16 = best;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    (best->m_backend).exp = *(int *)((long)&(pIVar5->val).m_backend + 0x70);
    (best->m_backend).neg = *(bool *)((long)&(pIVar5->val).m_backend + 0x74);
    *(undefined8 *)&(best->m_backend).fpclass =
         *(undefined8 *)((long)&(pIVar5->val).m_backend + 0x78);
    DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,
                            ((this->prices).data.
                             super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                             ._M_impl.super__Vector_impl_data._M_start)->idx);
  }
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxSteepPR<R>::buildBestPriceVectorEnterDim(R& best, R feastol)
{
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   int idx;
   int nsorted;
   R x;
   typename SPxPricer<R>::IdxElement price;

   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, coWeights_ptr[idx], feastol);
         price.idx = idx;
         prices.append(price);
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = prices[0].val;
      return this->thesolver->coId(prices[0].idx);
   }
   else
      return SPxId();
}